

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::BrokerServer::forceTerminate(BrokerServer *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  shared_ptr<helics::Broker> *brk;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  brokerList;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  __shared_ptr *in_stack_ffffffffffffffc0;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  in_stack_ffffffffffffffd0;
  
  closeServers((BrokerServer *)in_stack_ffffffffffffffd0._M_current);
  BrokerFactory::getAllBrokers();
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::begin
            (in_stack_ffffffffffffffa8);
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::end
            (in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                           ((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                             *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffc0 =
         (__shared_ptr *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
         ::operator*((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                      *)&stack0xffffffffffffffd0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(in_stack_ffffffffffffffc0);
    if (bVar1) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e86b8);
      uVar2 = (*peVar3->_vptr_Broker[4])();
      in_stack_ffffffffffffffb0 = CONCAT13((char)uVar2,(int3)in_stack_ffffffffffffffb0);
      if ((uVar2 & 1) != 0) {
        peVar3 = CLI::std::
                 __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e86de);
        (*peVar3->_vptr_Broker[3])();
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
           *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void BrokerServer::forceTerminate()
{
    closeServers();
    auto brokerList = BrokerFactory::getAllBrokers();
    for (auto& brk : brokerList) {
        if (!brk) {
            continue;
        }
        if (brk->isConnected()) {
            brk->disconnect();
        }
    }
}